

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O0

int __thiscall CWire::GetRoutableLength(CWire *this,int iLayer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CDesign *this_00;
  CLayer *this_01;
  CBoundary *pCVar5;
  int local_48;
  int i_1;
  int iMaxY;
  int iMinY;
  int iX;
  int i;
  int iMaxX;
  int iMinX;
  int iY;
  CLayer *pLayer;
  int iLayer_local;
  CWire *this_local;
  
  this_00 = CObject::GetDesign();
  this_01 = CDesign::GetLayer(this_00,iLayer);
  iVar1 = IsHorizontal(this);
  if (iVar1 == 0) {
    iVar1 = IsVertical(this);
    if (iVar1 != 0) {
      iVar1 = CLayer::IsHorizontal(this_01);
      if (iVar1 != 0) {
        return 0;
      }
      iVar1 = CPoint::X(this->m_pPointS);
      iVar2 = CPoint::X(this->m_pPointE);
      if (iVar1 != iVar2) {
        __assert_fail("m_pPointS->X()==m_pPointE->X()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                      ,0x5ac,"int CWire::GetRoutableLength(int)");
      }
      iVar1 = CPoint::X(this->m_pPointS);
      iVar2 = CPoint::Y(this->m_pPointS);
      iVar3 = CPoint::Y(this->m_pPointE);
      local_48 = iVar2;
      if (iVar3 <= iVar2) {
        __assert_fail("iMinY<iMaxY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                      ,0x5b1,"int CWire::GetRoutableLength(int)");
      }
      for (; local_48 < iVar3; local_48 = local_48 + 1) {
        pCVar5 = CLayer::GetBoundary(this_01,iVar1,local_48);
        iVar4 = CBoundary::GetCapacity(pCVar5,0x1000);
        if (iVar4 < 2) {
          return local_48 - iVar2;
        }
      }
    }
  }
  else {
    iVar1 = CLayer::IsVertical(this_01);
    if (iVar1 != 0) {
      return 0;
    }
    iVar1 = CPoint::Y(this->m_pPointS);
    iVar2 = CPoint::Y(this->m_pPointE);
    if (iVar1 != iVar2) {
      __assert_fail("m_pPointS->Y()==m_pPointE->Y()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                    ,0x59d,"int CWire::GetRoutableLength(int)");
    }
    iVar1 = CPoint::Y(this->m_pPointS);
    iVar2 = CPoint::X(this->m_pPointS);
    iVar3 = CPoint::X(this->m_pPointE);
    iMinY = iVar2;
    if (iVar3 <= iVar2) {
      __assert_fail("iMinX<iMaxX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                    ,0x5a3,"int CWire::GetRoutableLength(int)");
    }
    for (; iMinY < iVar3; iMinY = iMinY + 1) {
      pCVar5 = CLayer::GetBoundary(this_01,iMinY,iVar1);
      iVar4 = CBoundary::GetCapacity(pCVar5,0x1000);
      if (iVar4 < 2) {
        return iMinY - iVar2;
      }
    }
  }
  return -1;
}

Assistant:

int CWire::GetRoutableLength(int iLayer)
{
	CLayer*	pLayer		=	GetDesign()->GetLayer(iLayer);

	if(IsHorizontal())
	{
		if(pLayer->IsVertical())	return	FALSE;

		assert(m_pPointS->Y()==m_pPointE->Y());
		int	iY		=	m_pPointS->Y();
		int iMinX	=	m_pPointS->X();
		int	iMaxX	=	m_pPointE->X();

		// the last point doesn't require to update boundary [6/18/2006 thyeros]
		assert(iMinX<iMaxX);

		for (int i=iMinX;i<iMaxX;++i)	
			if(pLayer->GetBoundary(i,iY)->GetCapacity(GET_MODE_ACAP)<WIRE_WIDTH_SPACE)	return	i-iMinX;
	}
	else if(IsVertical())
	{
		if(pLayer->IsHorizontal())	return	FALSE;

		assert(m_pPointS->X()==m_pPointE->X());
		int	iX		=	m_pPointS->X();
		int iMinY	=	m_pPointS->Y();
		int	iMaxY	=	m_pPointE->Y();

		assert(iMinY<iMaxY);

		for (int i=iMinY;i<iMaxY;++i)
			//	if(pLayer->GetBoundary(iX,i)->GetCongestion()>0.8) 	return	FALSE;

			if(pLayer->GetBoundary(iX,i)->GetCapacity(GET_MODE_ACAP)<WIRE_WIDTH_SPACE)	return	i-iMinY;
	}	

	return	-1;
}